

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O2

int ffuky(fitsfile *fptr,int datatype,char *keyname,void *value,char *comm,int *status)

{
  ulong value_00;
  
  if (0 < *status) {
    return *status;
  }
  switch(datatype) {
  case 0xb:
    value_00 = (ulong)*value;
    break;
  case 0xc:
    value_00 = (ulong)*value;
    break;
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_00185c4f_caseD_d:
    *status = 0x19a;
    goto LAB_00185d2f;
  case 0xe:
    ffukyl(fptr,keyname,*value,comm,status);
    goto LAB_00185d2f;
  case 0x10:
    ffukys(fptr,keyname,(char *)value,comm,status);
    goto LAB_00185d2f;
  case 0x14:
    value_00 = (ulong)*value;
    break;
  case 0x15:
    value_00 = (ulong)*value;
    break;
  default:
    switch(datatype) {
    case 0x50:
switchD_00185c67_caseD_50:
      ffukyuj(fptr,keyname,*value,comm,status);
      break;
    case 0x51:
switchD_00185c67_caseD_51:
      value_00 = *value;
      goto LAB_00185d1e;
    case 0x52:
      ffukyd(fptr,keyname,*value,-0xf,comm,status);
      break;
    case 0x53:
      ffukyc(fptr,keyname,(float *)value,-7,comm,status);
      break;
    default:
      if (datatype == 0x1e) {
        ffukyg(fptr,keyname,(double)*value,0,comm,status);
        break;
      }
      if (datatype != 0x1f) {
        if (datatype != 0x28) {
          if (datatype != 0x29) {
            if (datatype == 0x2a) {
              ffukye(fptr,keyname,*value,-7,comm,status);
              break;
            }
            if (datatype == 0xa3) {
              ffukym(fptr,keyname,(double *)value,-0xf,comm,status);
              break;
            }
            goto switchD_00185c4f_caseD_d;
          }
          goto switchD_00185c67_caseD_51;
        }
        goto switchD_00185c67_caseD_50;
      }
      value_00 = (ulong)*value;
      goto LAB_00185d1e;
    }
    goto LAB_00185d2f;
  }
LAB_00185d1e:
  ffukyj(fptr,keyname,value_00,comm,status);
LAB_00185d2f:
  return *status;
}

Assistant:

int ffuky( fitsfile *fptr,     /* I - FITS file pointer        */
           int  datatype,      /* I - datatype of the value    */
           const char *keyname,/* I - name of keyword to write */
           void *value,        /* I - keyword value            */
           const char *comm,   /* I - keyword comment          */
           int  *status)       /* IO - error status            */
/*
  Update the keyword, value and comment in the FITS header.
  The datatype is specified by the 2nd argument.
*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TSTRING)
    {
        ffukys(fptr, keyname, (char *) value, comm, status);
    }
    else if (datatype == TBYTE)
    {
        ffukyj(fptr, keyname, (LONGLONG) *(unsigned char *) value, comm, status);
    }
    else if (datatype == TSBYTE)
    {
        ffukyj(fptr, keyname, (LONGLONG) *(signed char *) value, comm, status);
    }
    else if (datatype == TUSHORT)
    {
        ffukyj(fptr, keyname, (LONGLONG) *(unsigned short *) value, comm, status);
    }
    else if (datatype == TSHORT)
    {
        ffukyj(fptr, keyname, (LONGLONG) *(short *) value, comm, status);
    }
    else if (datatype == TINT)
    {
        ffukyj(fptr, keyname, (LONGLONG) *(int *) value, comm, status);
    }
    else if (datatype == TUINT)
    {
        ffukyg(fptr, keyname, (double) *(unsigned int *) value, 0,
               comm, status);
    }
    else if (datatype == TLOGICAL)
    {
        ffukyl(fptr, keyname, *(int *) value, comm, status);
    }
    else if (datatype == TULONG)
    {
        ffukyuj(fptr, keyname, (ULONGLONG) *(unsigned long *) value,
               comm, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffukyuj(fptr, keyname, (ULONGLONG) *(ULONGLONG *) value,
               comm, status);
    }
    else if (datatype == TLONG)
    {
        ffukyj(fptr, keyname, (LONGLONG) *(long *) value, comm, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffukyj(fptr, keyname, *(LONGLONG *) value, comm, status);
    }
    else if (datatype == TFLOAT)
    {
        ffukye(fptr, keyname, *(float *) value, -7, comm, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffukyd(fptr, keyname, *(double *) value, -15, comm, status);
    }
    else if (datatype == TCOMPLEX)
    {
        ffukyc(fptr, keyname, (float *) value, -7, comm, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
        ffukym(fptr, keyname, (double *) value, -15, comm, status);
    }
    else
        *status = BAD_DATATYPE;

    return(*status);
}